

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::vertex_attribi4(NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  allocator<char> local_41;
  string local_40;
  GLuint local_1c;
  GLint local_18;
  GLuint valUint;
  GLint valInt;
  int maxVertexAttribs;
  NegativeTestContext *ctx_local;
  
  _valInt = ctx;
  valUint = NegativeTestContext::getInteger(ctx,0x8869);
  this = _valInt;
  local_18 = 0;
  local_1c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_41);
  NegativeTestContext::beginSection(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glVertexAttribI4i
            (&_valInt->super_CallLogWrapper,valUint,local_18,local_18,local_18,local_18);
  NegativeTestContext::expectError(_valInt,0x501);
  glu::CallLogWrapper::glVertexAttribI4ui
            (&_valInt->super_CallLogWrapper,valUint,local_1c,local_1c,local_1c,local_1c);
  NegativeTestContext::expectError(_valInt,0x501);
  NegativeTestContext::endSection(_valInt);
  return;
}

Assistant:

void vertex_attribi4 (NegativeTestContext& ctx)
{
	int maxVertexAttribs	= ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	GLint valInt			= 0;
	GLuint valUint			= 0;

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	ctx.glVertexAttribI4i(maxVertexAttribs, valInt, valInt, valInt, valInt);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttribI4ui(maxVertexAttribs, valUint, valUint, valUint, valUint);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}